

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_piece_deadline
          (torrent *this,piece_index_t piece,int t,deadline_flags_t flags)

{
  element_type *peVar1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  peer_connection_interface *ppVar2;
  rep rVar3;
  rep rVar4;
  deadline_flags_t dVar5;
  undefined3 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pointer pptVar8;
  bool bVar9;
  download_priority_t dVar10;
  bool bVar11;
  int iVar12;
  time_point tVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar14;
  pointer ptVar15;
  pointer ptVar16;
  __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
  __position;
  pointer ptVar17;
  undefined8 uVar18;
  __uniq_ptr_data<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>,_true,_true>
  _Var19;
  pointer pptVar20;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_88 [24];
  element_type *peStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  piece_index_t piece_local;
  downloading_piece pi;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  
  piece_local = piece;
  if (((((this->super_torrent_hot_members).field_0x4b & 4) != 0) ||
      (peVar1 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      piece.m_val < 0 || (peVar1->m_files).m_piece_length < 1)) ||
     ((peVar1->m_files).m_num_pieces <= piece.m_val)) {
    if ((flags.m_val & 1) != 0) {
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_88);
      downloaders.
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(downloaders.
                             super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x7d);
      bVar9 = boost::system::detail::failed_impl
                        (0x7d,&boost::system::detail::cat_holder<void>::generic_category_instance.
                               super_error_category);
      downloaders.
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_start._0_5_ =
           CONCAT14(bVar9,downloaders.
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_);
      downloaders.
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)&boost::system::detail::cat_holder<void>::generic_category_instance;
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                ((alert_manager *)CONCAT44(extraout_var,iVar12),(torrent_handle *)local_88,
                 &piece_local,(error_code *)&downloaders);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    }
    return;
  }
  tVar13 = time_now();
  bVar9 = is_seed(this);
  if ((bVar9) ||
     ((this_00._M_head_impl =
            (this->super_torrent_hot_members).m_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
      this_00._M_head_impl != (piece_picker *)0x0 &&
      (bVar9 = piece_picker::has_piece_passed(this_00._M_head_impl,piece), bVar9)))) {
    if ((flags.m_val & 1) == 0) {
      return;
    }
    read_piece(this,piece);
    return;
  }
  ptVar16 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar17 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar16 == ptVar17) {
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&pi,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[7])();
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,(__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&pi);
    local_88._0_8_ =
         &downloaders.
          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    downloaders.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(1,downloaders.
                             super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    downloaders.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar12);
    plVar14 = (long *)__tls_get_addr(&PTR_004d3f18);
    if (*plVar14 == 0) {
      uVar18 = 0;
    }
    else {
      uVar18 = *(undefined8 *)(*plVar14 + 8);
    }
    local_88._8_8_ =
         boost::asio::detail::thread_info_base::
         allocate<boost::asio::detail::thread_info_base::default_tag>(uVar18,0x30);
    _Var7._M_pi = local_98._M_refcount._M_pi;
    *(undefined8 *)local_88._8_8_ = 0;
    *(code **)(local_88._8_8_ + 8) =
         boost::asio::detail::
         executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:5237:30),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         ::do_complete;
    *(uint *)(local_88._8_8_ + 0x10) = 0;
    local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((operation *)(local_88._8_8_ + 0x18))->next_ = (scheduler_operation *)local_98._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_88._8_8_ + 0x20) = _Var7._M_pi;
    local_98._M_ptr = (element_type *)0x0;
    local_88._16_8_ = local_88._8_8_;
    boost::asio::detail::scheduler::post_immediate_completion
              ((scheduler *)
               downloaders.
               super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1],(operation *)local_88._8_8_,
               SUB41((downloaders.
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_ & 2) >> 1,0));
    local_88._8_8_ =
         (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          )0x0;
    local_88._16_8_ =
         (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
          )0x0;
    boost::asio::detail::
    executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:5237:30),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
    ::ptr::reset((ptr *)local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pi.field_0x8);
    ptVar16 = (this->m_time_critical_pieces).
              super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ptVar17 = (this->m_time_critical_pieces).
              super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  _Var19.
  super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
  .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
       (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
        )((long)tVar13.__d.__r + (long)t * 1000000);
  do {
    ptVar15 = ptVar16;
    ptVar16 = ptVar15 + 1;
    if (ptVar15 == ptVar17) {
      need_picker(this);
      local_88._0_8_ = -0x8000000000000000;
      local_88._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x8000000000000000;
      peStack_70 = (element_type *)CONCAT71(peStack_70._1_7_,flags.m_val);
      peStack_70 = (element_type *)((ulong)peStack_70 & 0xffffffff);
      local_68._M_pi._0_4_ = piece.m_val;
      local_88._16_8_ =
           _Var19.
           super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
      __position = ::std::
                   __upper_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::time_critical_piece*,std::vector<libtorrent::aux::time_critical_piece,std::allocator<libtorrent::aux::time_critical_piece>>>,libtorrent::aux::time_critical_piece,__gnu_cxx::__ops::_Val_less_iter>
                             ((this->m_time_critical_pieces).
                              super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->m_time_critical_pieces).
                              super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(value_type *)local_88);
      ::std::
      vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
      ::insert(&this->m_time_critical_pieces,(const_iterator)__position._M_current,
               (value_type *)local_88);
      dVar10 = piece_picker::piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,piece);
      bVar9 = is_finished(this);
      bVar11 = piece_picker::set_piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,piece,(download_priority_t)0x7);
      if ((dVar10.m_val == '\0') && (update_gauge(this), bVar11)) {
        update_peer_interest(this,bVar9);
      }
      pi.index.m_val = 0x7fffffff;
      pi.info_idx = 0xffff;
      pi._6_4_ = 0;
      pi._10_2_ = 0;
      piece_picker::piece_info
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece,
                 &pi);
      if ((pi._10_2_ & 0x7fff) == 0) {
        return;
      }
      piece_picker::get_downloaders
                (&downloaders,
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
      pptVar8 = downloaders.
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar12 = 0;
      for (pptVar20 = downloaders.
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pptVar20 != pptVar8;
          pptVar20 = pptVar20 + 1) {
        if ((*pptVar20 != (torrent_peer *)0x0) &&
           (ppVar2 = (*pptVar20)->connection, ppVar2 != (peer_connection_interface *)0x0)) {
          local_98._M_ptr = (element_type *)CONCAT44(iVar12,piece.m_val);
          peer_connection::make_time_critical
                    ((peer_connection *)(ppVar2 + -0x10),(piece_block *)&local_98);
        }
        iVar12 = iVar12 + 1;
      }
      ::std::
      _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ::~_Vector_base(&downloaders.
                       super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     );
      return;
    }
  } while ((ptVar15->piece).m_val != piece.m_val);
  (ptVar15->deadline).__d.__r =
       (rep)_Var19.
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  (ptVar15->flags).m_val = flags.m_val;
  while ((ptVar17 = ptVar16 + -1,
         ptVar16 !=
         (this->m_time_critical_pieces).
         super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
         ._M_impl.super__Vector_impl_data._M_finish &&
         ((ptVar16->deadline).__d.__r < ptVar16[-1].deadline.__d.__r))) {
    local_68._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar16[-1].piece;
    local_88._0_8_ = (ptVar17->first_requested).__d.__r;
    local_88._8_8_ = ptVar16[-1].last_requested.__d.__r;
    local_88._16_8_ = ptVar16[-1].deadline.__d.__r;
    peStack_70 = *(element_type **)&ptVar16[-1].flags;
    ptVar16[-1].piece.m_val = (ptVar16->piece).m_val;
    rVar3 = (ptVar16->first_requested).__d.__r;
    rVar4 = (ptVar16->last_requested).__d.__r;
    dVar5.m_val = (ptVar16->flags).m_val;
    uVar6 = *(undefined3 *)&ptVar16->field_0x19;
    iVar12 = ptVar16->peers;
    ptVar16[-1].deadline.__d.__r = (ptVar16->deadline).__d.__r;
    ptVar16[-1].flags = (deadline_flags_t)dVar5.m_val;
    *(undefined3 *)&ptVar16[-1].field_0x19 = uVar6;
    ptVar16[-1].peers = iVar12;
    (ptVar17->first_requested).__d.__r = rVar3;
    ptVar16[-1].last_requested.__d.__r = rVar4;
    (ptVar16->piece).m_val = local_68._M_pi._0_4_;
    (ptVar16->deadline).__d.__r = local_88._16_8_;
    *(element_type **)&ptVar16->flags = peStack_70;
    (ptVar16->first_requested).__d.__r = local_88._0_8_;
    (ptVar16->last_requested).__d.__r = local_88._8_8_;
    ptVar16 = ptVar16 + 1;
  }
  while ((ptVar17 !=
          (this->m_time_critical_pieces).
          super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
          ._M_impl.super__Vector_impl_data._M_start &&
         ((ptVar17->deadline).__d.__r < ptVar17[-1].deadline.__d.__r))) {
    local_68._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar17->piece;
    local_88._0_8_ = (ptVar17->first_requested).__d.__r;
    local_88._8_8_ = (ptVar17->last_requested).__d.__r;
    local_88._16_8_ = (ptVar17->deadline).__d.__r;
    peStack_70 = *(element_type **)&ptVar17->flags;
    rVar3 = ptVar17[-1].last_requested.__d.__r;
    rVar4 = ptVar17[-1].deadline.__d.__r;
    dVar5.m_val = ptVar17[-1].flags.m_val;
    uVar6 = *(undefined3 *)&ptVar17[-1].field_0x19;
    iVar12 = ptVar17[-1].peers;
    (ptVar17->first_requested).__d.__r = ptVar17[-1].first_requested.__d.__r;
    (ptVar17->last_requested).__d.__r = rVar3;
    (ptVar17->deadline).__d.__r = rVar4;
    ptVar17->flags = (deadline_flags_t)dVar5.m_val;
    *(undefined3 *)&ptVar17->field_0x19 = uVar6;
    ptVar17->peers = iVar12;
    (ptVar17->piece).m_val = ptVar17[-1].piece.m_val;
    ptVar17[-1].first_requested.__d.__r = local_88._0_8_;
    ptVar17[-1].last_requested.__d.__r = local_88._8_8_;
    ptVar17[-1].deadline.__d.__r = local_88._16_8_;
    *(element_type **)&ptVar17[-1].flags = peStack_70;
    ptVar17[-1].piece.m_val = local_68._M_pi._0_4_;
    ptVar17 = ptVar17 + -1;
  }
  dVar10 = piece_picker::piece_priority
                     ((this->super_torrent_hot_members).m_picker._M_t.
                      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                      piece);
  bVar9 = is_finished(this);
  bVar11 = piece_picker::set_piece_priority
                     ((this->super_torrent_hot_members).m_picker._M_t.
                      super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                      .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                      piece,(download_priority_t)0x7);
  if (dVar10.m_val != '\0') {
    return;
  }
  update_gauge(this);
  if (!bVar11) {
    return;
  }
  update_peer_interest(this,bVar9);
  return;
}

Assistant:

void torrent::set_piece_deadline(piece_index_t const piece, int const t
		, deadline_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT_PRECOND(piece >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(valid_metadata());
		TORRENT_ASSERT_PRECOND(valid_metadata() && piece < m_torrent_file->end_piece());

		if (m_abort || !valid_metadata()
			|| piece < piece_index_t(0)
			|| piece >= m_torrent_file->end_piece())
		{
			// failed
			if (flags & torrent_handle::alert_when_available)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			return;
		}

		time_point const deadline = aux::time_now() + milliseconds(t);

		// if we already have the piece, no need to set the deadline.
		// however, if the user asked to get the piece data back, we still
		// need to read it and post it back to the user
		if (is_seed() || (has_picker() && m_picker->has_piece_passed(piece)))
		{
			if (flags & torrent_handle::alert_when_available)
				read_piece(piece);
			return;
		}

		// if this is the first time critical piece we add. in order to make it
		// react quickly, cancel all the currently outstanding requests
		if (m_time_critical_pieces.empty())
		{
			// defer this by posting it to the end of the message queue.
			// this gives the client a chance to specify multiple time-critical
			// pieces before libtorrent cancels requests
			auto self = shared_from_this();
			post(m_ses.get_context(), [self] { self->wrap(&torrent::cancel_non_critical); });
		}

		for (auto i = m_time_critical_pieces.begin()
			, end(m_time_critical_pieces.end()); i != end; ++i)
		{
			if (i->piece != piece) continue;
			i->deadline = deadline;
			i->flags = flags;

			// resort i since deadline might have changed
			while (std::next(i) != m_time_critical_pieces.end() && i->deadline > std::next(i)->deadline)
			{
				std::iter_swap(i, std::next(i));
				++i;
			}
			while (i != m_time_critical_pieces.begin() && i->deadline < std::prev(i)->deadline)
			{
				std::iter_swap(i, std::prev(i));
				--i;
			}
			// just in case this piece had priority 0
			download_priority_t const prev_prio = m_picker->piece_priority(piece);
			bool const was_finished = is_finished();
			bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
			if (prev_prio == dont_download)
			{
				update_gauge();
				if (filter_updated) update_peer_interest(was_finished);
			}
			return;
		}

		need_picker();

		time_critical_piece p;
		p.first_requested = min_time();
		p.last_requested = min_time();
		p.flags = flags;
		p.deadline = deadline;
		p.peers = 0;
		p.piece = piece;
		auto const critical_piece_it = std::upper_bound(m_time_critical_pieces.begin()
			, m_time_critical_pieces.end(), p);
		m_time_critical_pieces.insert(critical_piece_it, p);

		// just in case this piece had priority 0
		download_priority_t const prev_prio = m_picker->piece_priority(piece);
		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
		if (prev_prio == dont_download)
		{
			update_gauge();
			if (filter_updated) update_peer_interest(was_finished);
		}

		piece_picker::downloading_piece pi;
		m_picker->piece_info(piece, pi);
		if (pi.requested == 0) return;
		// this means we have outstanding requests (or queued
		// up requests that haven't been sent yet). Promote them
		// to deadline pieces immediately
		std::vector<torrent_peer*> const downloaders
			= m_picker->get_downloaders(piece);

		int block = 0;
		for (auto i = downloaders.begin()
			, end(downloaders.end()); i != end; ++i, ++block)
		{
			torrent_peer* const tp = *i;
			if (tp == nullptr || tp->connection == nullptr) continue;
			auto* peer = static_cast<peer_connection*>(tp->connection);
			peer->make_time_critical(piece_block(piece, block));
		}
	}